

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledRgba.cpp
# Opt level: O0

void anon_unknown.dwarf_23240a::writeRead
               (string *tempDir,int W,int H,Compression comp,int xSize,int ySize)

{
  int in_ECX;
  string filename;
  int in_stack_000002ac;
  Compression in_stack_000002b0;
  RgbaChannels in_stack_000002b4;
  int in_stack_000002b8;
  int in_stack_000002bc;
  char *in_stack_000002c0;
  int in_stack_000002cc;
  Compression in_stack_000002d0;
  RgbaChannels in_stack_000002d4;
  int in_stack_000002d8;
  int in_stack_000002dc;
  Compression in_stack_000002e0;
  RgbaChannels in_stack_000002e4;
  int in_stack_000002e8;
  int in_stack_000002ec;
  int in_stack_000002f0;
  undefined4 in_stack_000002f4;
  int in_stack_00000300;
  char *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  
  std::operator+(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::__cxx11::string::c_str();
  writeReadRGBAONE((char *)CONCAT44(in_stack_000002f4,in_stack_000002f0),in_stack_000002ec,
                   in_stack_000002e8,in_stack_000002e4,in_stack_000002e0,in_stack_000002dc,
                   in_stack_00000300);
  if ((((in_ECX != 6) && (in_ECX != 7)) && (in_ECX != 8)) && (in_ECX != 9)) {
    std::__cxx11::string::c_str();
    writeReadRGBAMIP(in_stack_000002c0,in_stack_000002bc,in_stack_000002b8,in_stack_000002b4,
                     in_stack_000002b0,in_stack_000002ac,in_stack_000002d0);
    std::__cxx11::string::c_str();
    writeReadRGBARIP((char *)CONCAT44(in_stack_000002e4,in_stack_000002e0),in_stack_000002dc,
                     in_stack_000002d8,in_stack_000002d4,in_stack_000002d0,in_stack_000002cc,
                     in_stack_000002f0);
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  return;
}

Assistant:

void
writeRead (
    const std::string& tempDir,
    int                W,
    int                H,
    Compression        comp,
    int                xSize,
    int                ySize)
{
    std::string filename = tempDir + "imf_test_tiled_rgba.exr";

    writeReadRGBAONE (filename.c_str (), W, H, WRITE_RGBA, comp, xSize, ySize);

    if (comp != B44_COMPRESSION && comp != B44A_COMPRESSION &&
        comp != DWAA_COMPRESSION && comp != DWAB_COMPRESSION)
    {
        //
        // Skip mipmaps and ripmaps with B44 or DWA compression; writing
        // an image with a single resolution level, above, should be enough
        // to verify that B44 and DWA compression work with tiled files.
        //

        writeReadRGBAMIP (
            filename.c_str (), W, H, WRITE_RGBA, comp, xSize, ySize);

        writeReadRGBARIP (
            filename.c_str (), W, H, WRITE_RGBA, comp, xSize, ySize);
    }
}